

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

bool __thiscall VWReaderHandler<true>::Null(VWReaderHandler<true> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Context<true> *in_RDI;
  
  iVar2 = (**in_RDI->current_state->_vptr_BaseState)();
  bVar1 = Context<true>::TransitionState(in_RDI,(BaseState<true> *)CONCAT44(extraout_var,iVar2));
  return bVar1;
}

Assistant:

bool Null() { return ctx.TransitionState(ctx.current_state->Null(ctx)); }